

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::LeaveMulticastGroup(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  uint uVar1;
  HashElement *pHVar2;
  RTPMemoryManager *pRVar3;
  bool bVar4;
  HashElement *pHVar5;
  HashElement *pHVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  ip_mreq mreq;
  uint local_28;
  uint local_24;
  
  if (this->init != true) {
    return -0x5a;
  }
  if (this->created != true) {
    return -0x59;
  }
  if (addr->addresstype != IPv4Address) {
    return -0x54;
  }
  uVar1 = *(uint *)&addr->field_0xc;
  if ((uVar1 & 0xf0000000) != 0xe0000000) {
    return -0x58;
  }
  pHVar6 = (this->multicastgroups).table[uVar1 % 0x207d];
  (this->multicastgroups).curhashelem = pHVar6;
  bVar4 = false;
  do {
    pHVar5 = pHVar6;
    if (pHVar5 == (HashElement *)0x0) {
      iVar7 = -5;
      goto LAB_00122d35;
    }
    pHVar6 = pHVar5;
    bVar8 = true;
    if (pHVar5->element != uVar1) {
      pHVar6 = pHVar5->hashnext;
      (this->multicastgroups).curhashelem = pHVar6;
      bVar8 = bVar4;
    }
    bVar4 = bVar8;
  } while (!bVar8);
  iVar7 = 0;
LAB_00122d35:
  if (pHVar5 == (HashElement *)0x0) goto LAB_00122e01;
  pHVar6 = (this->multicastgroups).curhashelem;
  if (pHVar6 == (HashElement *)0x0) {
    iVar7 = -7;
    goto LAB_00122e01;
  }
  pHVar5 = pHVar6->hashprev;
  pHVar2 = pHVar6->hashnext;
  if (pHVar5 == (HashElement *)0x0) {
    (this->multicastgroups).table[pHVar6->hashindex] = pHVar2;
    if (pHVar2 != (HashElement *)0x0) {
      pHVar5 = (HashElement *)0x0;
      goto LAB_00122d7e;
    }
  }
  else {
    pHVar5->hashnext = pHVar2;
    if (pHVar2 != (HashElement *)0x0) {
LAB_00122d7e:
      pHVar2->hashprev = pHVar5;
    }
  }
  pHVar6 = (this->multicastgroups).curhashelem;
  pHVar5 = pHVar6->listprev;
  pHVar2 = pHVar6->listnext;
  if (pHVar5 == (HashElement *)0x0) {
    (this->multicastgroups).firsthashelem = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      (this->multicastgroups).lasthashelem = (HashElement *)0x0;
    }
    else {
      pHVar2->listprev = (HashElement *)0x0;
    }
  }
  else {
    pHVar5->listnext = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      (this->multicastgroups).lasthashelem = pHVar5;
    }
    else {
      pHVar2->listprev = pHVar5;
    }
  }
  pRVar3 = (this->multicastgroups).super_RTPMemoryObject.mgr;
  if (pRVar3 == (RTPMemoryManager *)0x0) {
    if (pHVar6 != (HashElement *)0x0) {
      operator_delete(pHVar6,0x28);
    }
  }
  else {
    (**(code **)(*(long *)pRVar3 + 0x18))();
  }
  (this->multicastgroups).curhashelem = pHVar2;
  iVar7 = 0;
LAB_00122e01:
  if (-1 < iVar7) {
    uVar9 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = this->mcastifaceIP;
    _local_28 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18,uVar9);
    iVar7 = 0;
    setsockopt(this->rtpsock,0,0x24,&local_28,8);
    if (this->rtpsock != this->rtcpsock) {
      uVar1 = this->mcastifaceIP;
      _local_28 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18,uVar9);
      iVar7 = 0;
      setsockopt(this->rtcpsock,0,0x24,&local_28,8);
    }
  }
  return iVar7;
}

Assistant:

int RTPUDPv4Transmitter::LeaveMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	uint32_t mcastIP = address.GetIP();
	
	if (!RTPUDPV4TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.DeleteElement(mcastIP);
	if (status >= 0)
	{	
		RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
		if (rtpsock != rtcpsock) // no need to leave multicast group twice when multiplexing
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_DROP_MEMBERSHIP,mcastIP,status);

		status = 0;
	}
	
	MAINMUTEX_UNLOCK
	return status;
}